

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tokenizer.cc
# Opt level: O2

bool __thiscall Finder::check(Finder *this)

{
  element_type *peVar1;
  bool bVar2;
  long lVar3;
  longlong lVar4;
  allocator<char> local_111;
  QPDFTokenizer tokenizer;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> local_108;
  size_type local_f8 [13];
  Token t;
  
  QPDFTokenizer::QPDFTokenizer(&tokenizer);
  std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_108,&(this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_f8,"finder",&local_111);
  QPDFTokenizer::readToken(&t,&tokenizer,&local_108,local_f8,1,0);
  std::__cxx11::string::~string((string *)local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  lVar3 = (**(code **)(*(long *)(this->is).
                                super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                      0x20))();
  QPDFTokenizer::Token::Token((Token *)local_f8,tt_word,(string *)&this->str);
  bVar2 = QPDFTokenizer::Token::operator==(&t,(Token *)local_f8);
  QPDFTokenizer::Token::~Token((Token *)local_f8);
  peVar1 = (this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f8[0] = (this->str)._M_string_length;
  lVar4 = QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert(local_f8);
  (**(code **)(*(long *)peVar1 + 0x28))(peVar1,lVar3 - lVar4,0);
  QPDFTokenizer::Token::~Token(&t);
  QPDFTokenizer::~QPDFTokenizer(&tokenizer);
  return bVar2;
}

Assistant:

bool
Finder::check()
{
    QPDFTokenizer tokenizer;
    QPDFTokenizer::Token t = tokenizer.readToken(is, "finder", true);
    qpdf_offset_t offset = this->is->tell();
    bool result = (t == QPDFTokenizer::Token(QPDFTokenizer::tt_word, str));
    this->is->seek(offset - QIntC::to_offset(this->str.length()), SEEK_SET);
    return result;
}